

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O0

void create_encoded_string_storage_from_DecodedResult_smallExample_isSuccessful(void)

{
  bech32_DecodedResult *decodedResult_00;
  bech32_bstring *bstring_00;
  bech32_bstring *bstring;
  bech32_DecodedResult *decodedResult;
  char bstr [14];
  
  stack0xffffffffffffffea = 0x39727a70317a7978;
  builtin_strncpy(bstr,"dvupm",6);
  decodedResult_00 = bech32_create_DecodedResult((char *)((long)&decodedResult + 2));
  if (decodedResult_00 == (bech32_DecodedResult *)0x0) {
    __assert_fail("decodedResult != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x24b,
                  "void create_encoded_string_storage_from_DecodedResult_smallExample_isSuccessful(void)"
                 );
  }
  bstring_00 = bech32_create_bstring_from_DecodedResult(decodedResult_00);
  if (bstring_00 != (bech32_bstring *)0x0) {
    bech32_free_DecodedResult(decodedResult_00);
    bech32_free_bstring(bstring_00);
    return;
  }
  __assert_fail("bstring != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x24e,
                "void create_encoded_string_storage_from_DecodedResult_smallExample_isSuccessful(void)"
               );
}

Assistant:

void create_encoded_string_storage_from_DecodedResult_smallExample_isSuccessful(void) {
    char bstr[] = "xyz1pzr9dvupm";
    bech32_DecodedResult *decodedResult = bech32_create_DecodedResult(bstr);
    assert(decodedResult != NULL);

    bech32_bstring *bstring = bech32_create_bstring_from_DecodedResult(decodedResult);
    assert(bstring != NULL);

    bech32_free_DecodedResult(decodedResult);
    bech32_free_bstring(bstring);
}